

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O2

void __thiscall Nes_Namco::run_until(Nes_Namco *this,cpu_time_t nes_end_time)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  Blip_Buffer *blip_buf;
  unsigned_long uVar4;
  int iVar5;
  int iVar6;
  Namco_Osc *pNVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  blip_resampled_time_t time;
  int iVar13;
  
  uVar11 = (ulong)(this->reg[0x7f] >> 4 & 7);
  uVar12 = uVar11 ^ 7;
  do {
    if (uVar12 == 8) {
      this->last_time = nes_end_time;
      return;
    }
    blip_buf = this->oscs[uVar12].output;
    if (blip_buf != (Blip_Buffer *)0x0) {
      pNVar7 = this->oscs + uVar12;
      uVar4 = blip_buf->factor_;
      time = this->last_time * uVar4 + blip_buf->offset_ + pNVar7->delay;
      uVar8 = uVar4 * nes_end_time + blip_buf->offset_;
      pNVar7->delay = 0;
      if (time < uVar8) {
        bVar2 = (byte)(this->synth).impulses[uVar12 * 2 + -0x10];
        if (0x1f < bVar2) {
          lVar1 = uVar12 * 8;
          bVar3 = *(byte *)((long)(this->synth).impulses + lVar1 + -0x3d);
          if (((bVar3 & 0xf) != 0) &&
             (uVar10 = (ulong)this->reg[lVar1 + 0x40] |
                       (ulong)((uint)this->reg[lVar1 + 0x42] << 8 | (bVar2 & 3) << 0x10),
             uVar10 != 0)) {
            iVar9 = (int)pNVar7->last_amp;
            iVar6 = (int)pNVar7->wave_pos;
            do {
              iVar5 = (uint)*(byte *)((long)(this->synth).impulses + lVar1 + -0x3e) + iVar6;
              iVar13 = (this->reg[iVar5 >> 1] >> ((char)iVar5 * '\x04' & 4U) & 0xf) * (bVar3 & 0xf);
              iVar5 = iVar13 - iVar9;
              if (iVar5 != 0) {
                Blip_Synth<3,_15>::offset_resampled(&this->synth,time,iVar5,blip_buf);
                iVar9 = iVar13;
              }
              iVar6 = iVar6 + 1;
              time = time + ((uVar4 * 0xf0000) / uVar10) * (uVar11 + 1);
              if ((int)(uint)(byte)(0x20 - (bVar2 & 0x1c)) <= iVar6) {
                iVar6 = 0;
              }
            } while (time < uVar8);
            pNVar7->wave_pos = (short)iVar6;
            pNVar7->last_amp = (short)iVar9;
            goto LAB_001128c6;
          }
        }
      }
      else {
LAB_001128c6:
        pNVar7->delay = time - uVar8;
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void Nes_Namco::run_until( cpu_time_t nes_end_time )
{
	int active_oscs = ((reg [0x7f] >> 4) & 7) + 1;
	for ( int i = osc_count - active_oscs; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		Blip_Buffer* output = osc.output;
		if ( !output )
			continue;
		
		Blip_Buffer::resampled_time_t time =
				output->resampled_time( last_time ) + osc.delay;
		Blip_Buffer::resampled_time_t end_time = output->resampled_time( nes_end_time );
		osc.delay = 0;
		if ( time < end_time )
		{
			const BOOST::uint8_t* osc_reg = &reg [i * 8 + 0x40];
			if ( !(osc_reg [4] & 0xe0) )
				continue;
			
			int volume = osc_reg [7] & 15;
			if ( !volume )
				continue;
			
			long freq = (osc_reg [4] & 3) * 0x10000 + osc_reg [2] * 0x100L + osc_reg [0];
			if ( !freq )
				continue;
			Blip_Buffer::resampled_time_t period =
					output->resampled_duration( 983040 ) / freq * active_oscs;
			
			int wave_size = (8 - ((osc_reg [4] >> 2) & 7)) * 4;
			if ( !wave_size )
				continue;
			
			int last_amp = osc.last_amp;
			int wave_pos = osc.wave_pos;
			
			do
			{
				// read wave sample
				int addr = wave_pos + osc_reg [6];
				int sample = reg [addr >> 1];
				wave_pos++;
				if ( addr & 1 )
					sample >>= 4;
				sample = (sample & 15) * volume;
				
				// output impulse if amplitude changed
				int delta = sample - last_amp;
				if ( delta )
				{
					last_amp = sample;
					synth.offset_resampled( time, delta, output );
				}
				
				// next sample
				time += period;
				if ( wave_pos >= wave_size )
					wave_pos = 0;
			}
			while ( time < end_time );
			
			osc.wave_pos = wave_pos;
			osc.last_amp = last_amp;
		}
		osc.delay = time - end_time;
	}
	
	last_time = nes_end_time;
}